

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  CharFormat CVar1;
  ostream *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  char *str;
  
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  CVar1 = PrintCharsAsStringTo<char>(unaff_retaddr,in_RDI,in_RSI);
  if ((CVar1 == kHexEscape) && ((FLAGS_gtest_print_utf8 & 1) != 0)) {
    str = (char *)std::__cxx11::string::data();
    std::__cxx11::string::size();
    anon_unknown_38::ConditionalPrintAsText(str,in_stack_ffffffffffffffd8,(ostream *)0x13c732);
  }
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG_GET(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}